

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternPainter.cpp
# Opt level: O2

int __thiscall PatternPainter::highlightIndex(PatternPainter *this,int rowno)

{
  int iVar1;
  
  if ((this->mHighlightInterval2 == 0) || (rowno % this->mHighlightInterval2 != 0)) {
    if ((this->mHighlightInterval1 == 0) || (rowno % this->mHighlightInterval1 != 0)) {
      return 0;
    }
    iVar1 = 1;
  }
  else {
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int PatternPainter::highlightIndex(int rowno) const {
    // this could probably be optimized better
    if (mHighlightInterval2 && rowno % mHighlightInterval2 == 0) {
        return 2;
    } else if (mHighlightInterval1 && rowno % mHighlightInterval1 == 0) {
        return 1;
    } else {
        return 0;
    }
}